

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_Flip(GPU_Target *target)

{
  GPU_Target *target_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    GPU_PushErrorCode("GPU_Flip",GPU_ERROR_USER_ERROR,"%s","NULL renderer");
  }
  else if ((target == (GPU_Target *)0x0) || (target->context != (GPU_Context *)0x0)) {
    if ((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
       ((target != (GPU_Target *)0x0 && (target->context != (GPU_Context *)0x0)))) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      GPU_PushErrorCode("GPU_Flip",GPU_ERROR_USER_ERROR,"%s","NULL context");
    }
    else {
      (*_gpu_current_renderer->impl->Flip)(_gpu_current_renderer,target);
    }
  }
  else {
    (*_gpu_current_renderer->impl->FlushBlitBuffer)(_gpu_current_renderer);
  }
  return;
}

Assistant:

void GPU_Flip(GPU_Target* target)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    
    if(target != NULL && target->context == NULL)
    {
        _gpu_current_renderer->impl->FlushBlitBuffer(_gpu_current_renderer);
        return;
    }
    
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    _gpu_current_renderer->impl->Flip(_gpu_current_renderer, target);
}